

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<void_(mp::obj::Type)>::~FunctionMockerBase
          (FunctionMockerBase<void_(mp::obj::Type)> *this)

{
  MutexLock l;
  UntypedFunctionMockerBase *in_stack_ffffffffffffffe8;
  GTestMutexLock local_10;
  
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_002b33e0;
  local_10.mutex_ = (MutexBase *)g_gmock_mutex;
  MutexBase::Lock((MutexBase *)g_gmock_mutex);
  UntypedFunctionMockerBase::VerifyAndClearExpectationsLocked
            (&this->super_UntypedFunctionMockerBase);
  Mock::UnregisterLocked(in_stack_ffffffffffffffe8);
  (*(this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase[2])(this);
  GTestMutexLock::~GTestMutexLock(&local_10);
  MatcherBase<mp::obj::Type>::~MatcherBase
            ((MatcherBase<mp::obj::Type> *)&(this->current_spec_).matchers_);
  UntypedFunctionMockerBase::~UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    MutexLock l(&g_gmock_mutex);
    VerifyAndClearExpectationsLocked();
    Mock::UnregisterLocked(this);
    ClearDefaultActionsLocked();
  }